

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

NodeAndBucket __thiscall
google::protobuf::internal::
KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
FindHelper(KeyMapBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,ViewType k,TreeIterator *it)

{
  TableEntryPtr entry;
  bool bVar1;
  map_index_t b;
  NodeBase *pNVar2;
  char *pcVar3;
  char *pcVar4;
  NodeAndBucket NVar5;
  VariantKey key;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  pcVar3 = k._M_str;
  local_38._M_len = k._M_len;
  local_38._M_str = pcVar3;
  b = BucketNumber(this,k);
  entry = (this->super_UntypedMapBase).table_[b];
  if ((entry & 1) == 0 && entry != 0) {
    pNVar2 = TableEntryToNode(entry);
    do {
      bVar1 = TransparentSupport<std::__cxx11::string>::
              Equals<std::__cxx11::string_const&,std::basic_string_view<char,std::char_traits<char>>&>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (pNVar2 + 1),&local_38);
      if (bVar1) goto LAB_00155f80;
      pNVar2 = pNVar2->next;
    } while (pNVar2 != (NodeBase *)0x0);
  }
  else if ((entry & 1) != 0) {
    pcVar4 = "";
    if (pcVar3 != (char *)0x0) {
      pcVar4 = pcVar3;
    }
    key.integral = k._M_len;
    key.data = pcVar4;
    NVar5 = UntypedMapBase::FindFromTree(&this->super_UntypedMapBase,b,key,it);
    pNVar2 = NVar5.node;
    b = NVar5.bucket;
    goto LAB_00155f80;
  }
  pNVar2 = (NodeBase *)0x0;
LAB_00155f80:
  NVar5.bucket = b;
  NVar5.node = pNVar2;
  NVar5._12_4_ = 0;
  return NVar5;
}

Assistant:

NodeAndBucket FindHelper(typename TS::ViewType k,
                           TreeIterator* it = nullptr) const {
    map_index_t b = BucketNumber(k);
    if (TableEntryIsNonEmptyList(b)) {
      auto* node = internal::TableEntryToNode(table_[b]);
      do {
        if (TS::Equals(static_cast<KeyNode*>(node)->key(), k)) {
          return {node, b};
        } else {
          node = node->next;
        }
      } while (node != nullptr);
    } else if (TableEntryIsTree(b)) {
      return FindFromTree(b, internal::RealKeyToVariantKey<Key>{}(k), it);
    }
    return {nullptr, b};
  }